

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O2

ON_ManifestMap_Hash32TableItem * __thiscall
ON_ManifestMap_SourceIdHash32Table::FirstManifestMapItemWithSourceId
          (ON_ManifestMap_SourceIdHash32Table *this,ON_UUID source_component_id)

{
  bool bVar1;
  ON__UINT32 hash32;
  ON_ManifestMap_Hash32TableItem *current_item;
  ON_Hash32Table *this_00;
  ON_UUID_struct local_28;
  
  local_28.Data4 = source_component_id.Data4;
  local_28._0_8_ = source_component_id._0_8_;
  bVar1 = ::operator==(&ON_nil_uuid,&local_28);
  if (!bVar1) {
    hash32 = ON_ManifestMapItem::SourceIdHash32(&local_28);
    this_00 = &(this->super_ON_ManifestMap_Hash32Table).super_ON_Hash32Table;
    for (current_item = (ON_ManifestMap_Hash32TableItem *)
                        ON_Hash32Table::FirstItemWithHash(this_00,hash32);
        current_item != (ON_ManifestMap_Hash32TableItem *)0x0;
        current_item = (ON_ManifestMap_Hash32TableItem *)
                       ON_Hash32Table::NextItemWithHash
                                 (this_00,&current_item->super_ON_Hash32TableItem)) {
      bVar1 = ::operator==(&local_28,&(current_item->m_map_item).m_source_id);
      if (bVar1) {
        return current_item;
      }
    }
  }
  return (ON_ManifestMap_Hash32TableItem *)0x0;
}

Assistant:

const ON_ManifestMap_Hash32TableItem* FirstManifestMapItemWithSourceId(
    ON_UUID source_component_id
    ) const
  {
    if (ON_nil_uuid == source_component_id)
      return nullptr;
    const ON__UINT32 hash32 = ON_ManifestMapItem::SourceIdHash32(source_component_id);
    for (const ON_Hash32TableItem* hash_table_item = FirstItemWithHash(hash32); nullptr != hash_table_item; hash_table_item = NextItemWithHash(hash_table_item))
    {
      if (source_component_id == ((const ON_ManifestMap_Hash32TableItem*)hash_table_item)->m_map_item.SourceId() )
        return (const ON_ManifestMap_Hash32TableItem*)hash_table_item;
    }
    return nullptr;
  }